

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O2

void pzgeom::TPZGeoPrism::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  uint uVar1;
  ulong uVar2;
  Fad<double> *pFVar3;
  int j;
  long row;
  ulong uVar4;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_4a8;
  TPZFNMatrix<6,_Fad<double>_> phi;
  TPZFNMatrix<18,_Fad<double>_> dphi;
  
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix(&phi,6,1);
  TPZFNMatrix<18,_Fad<double>_>::TPZFNMatrix(&dphi,3,6);
  pztopology::TPZPrism::TShape<Fad<double>>
            (loc,&phi.super_TPZFMatrix<Fad<double>_>,&dphi.super_TPZFMatrix<Fad<double>_>);
  uVar1 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    local_4a8.fadexpr_.left_ = (Fad<double> *)0x0;
    Fad<double>::operator=<double,_nullptr>(x->fStore + uVar4,(double *)&local_4a8);
    for (row = 0; row != 6; row = row + 1) {
      pFVar3 = TPZFMatrix<Fad<double>_>::operator()(&phi.super_TPZFMatrix<Fad<double>_>,row,0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar4,row);
      local_4a8.fadexpr_.right_.defaultVal = 0.0;
      local_4a8.fadexpr_.left_ = pFVar3;
      Fad<double>::operator+=(x->fStore + uVar4,&local_4a8);
    }
  }
  TPZFNMatrix<18,_Fad<double>_>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoPrism::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 6; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }